

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::compiles2v(json_service *this,string *f)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  bVar1 = std::operator==(f,"str");
  if (bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x62);
  std::operator<<(poVar2," f==\"str\"");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles2v(std::string f) {  TEST(f=="str"); }